

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
* __thiscall
HighsCliqueTable::computeMaximalCliques
          (HighsCliqueTable *this,
          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *vars,
          double feastol)

{
  bool bVar1;
  unsigned_long *puVar2;
  reference pvVar3;
  reference pCVar4;
  reference pvVar5;
  reference pvVar6;
  undefined8 in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *in_RDI;
  undefined8 in_XMM0_Qa;
  HighsInt in_stack_00000014;
  CliqueVar *in_stack_00000018;
  HighsInt in_stack_00000024;
  BronKerboschData *in_stack_00000028;
  HighsCliqueTable *in_stack_00000030;
  CliqueVar *var_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *__range1_2;
  BronKerboschData data;
  CliqueVar *var_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *__range1_1;
  vector<double,_std::allocator<double>_> sol;
  CliqueVar *var;
  const_iterator __end1;
  const_iterator __begin1;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *__range1;
  size_t maxcolindex;
  undefined4 in_stack_fffffffffffffe58;
  HighsInt in_stack_fffffffffffffe5c;
  BronKerboschData *in_stack_fffffffffffffe60;
  CliqueVar *__args;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *__new_size;
  __normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_160;
  undefined8 local_158;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> local_148 [5];
  undefined8 local_c0;
  reference local_98;
  CliqueVar *local_90;
  __normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_88;
  undefined8 local_80;
  vector<double,_std::allocator<double>_> local_68;
  ulong local_50;
  reference local_48;
  CliqueVar *local_40;
  __normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_38;
  undefined8 local_30;
  unsigned_long local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  __new_size = in_RDI;
  local_20 = in_XMM0_Qa;
  local_18 = in_RDX;
  bVar1 = std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          empty(in_RDI);
  if (bVar1) {
    memset(in_RDI,0,0x18);
    std::
    vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
    ::vector((vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
              *)0x53b3a0);
  }
  else {
    local_28 = 0;
    local_30 = local_18;
    local_38._M_current =
         (CliqueVar *)
         std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
         begin((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    local_40 = (CliqueVar *)
               std::
               vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
               end((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                               *)in_stack_fffffffffffffe60,
                              (__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                               *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)),
          bVar1) {
      local_48 = __gnu_cxx::
                 __normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                 ::operator*(&local_38);
      local_50 = (ulong)((uint)*local_48 & 0x7fffffff);
      puVar2 = std::max<unsigned_long>(&local_50,&local_28);
      local_28 = *puVar2;
      __gnu_cxx::
      __normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
      ::operator++(&local_38);
    }
    __args = (CliqueVar *)&local_68;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x53b475);
    std::vector<double,_std::allocator<double>_>::resize(in_RSI,(size_type)__new_size);
    local_80 = local_18;
    local_88._M_current =
         (CliqueVar *)
         std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
         begin((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    local_90 = (CliqueVar *)
               std::
               vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
               end((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                               *)in_stack_fffffffffffffe60,
                              (__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                               *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)),
          bVar1) {
      local_98 = __gnu_cxx::
                 __normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                 ::operator*(&local_88);
      in_stack_fffffffffffffe60 = (BronKerboschData *)(double)((uint)*local_98 >> 0x1f);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_68,(ulong)((uint)*local_98 & 0x7fffffff));
      *pvVar3 = (value_type)in_stack_fffffffffffffe60;
      __gnu_cxx::
      __normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
      ::operator++(&local_88);
    }
    BronKerboschData::BronKerboschData
              (in_stack_fffffffffffffe60,
               (vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    local_c0 = local_20;
    local_158 = local_18;
    local_160._M_current =
         (CliqueVar *)
         std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
         begin((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::end
              ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                               *)in_stack_fffffffffffffe60,
                              (__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                               *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)),
          bVar1) {
      pCVar4 = __gnu_cxx::
               __normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
               ::operator*(&local_160);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &in_RSI[10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,
                          (ulong)((uint)*pCVar4 & 0x7fffffff));
      if (((*pvVar5 == 0) &&
          (pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               &in_RSI[0xf].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (ulong)((uint)*pCVar4 & 0x7fffffff)), *pvVar6 == '\0')) &&
         (in_stack_fffffffffffffe5c =
               numCliques((HighsCliqueTable *)
                          CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                          SUB84((ulong)in_stack_fffffffffffffe60 >> 0x20,0)),
         in_stack_fffffffffffffe5c != 0)) {
        std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
        emplace_back<HighsCliqueTable::CliqueVar_const&>(in_RDI,__args);
      }
      __gnu_cxx::
      __normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
      ::operator++(&local_160);
    }
    std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::size
              (local_148);
    bronKerboschRecurse(in_stack_00000030,in_stack_00000028,in_stack_00000024,in_stack_00000018,
                        in_stack_00000014);
    std::
    vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
    ::vector((vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
              *)in_stack_fffffffffffffe60,
             (vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    BronKerboschData::~BronKerboschData(in_stack_fffffffffffffe60);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_RDI);
  }
  return (vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
          *)__new_size;
}

Assistant:

std::vector<std::vector<HighsCliqueTable::CliqueVar>>
HighsCliqueTable::computeMaximalCliques(const std::vector<CliqueVar>& vars,
                                        double feastol) {
  // return if there are no variables
  if (vars.empty())
    return std::vector<std::vector<HighsCliqueTable::CliqueVar>>{};

  // find max column index in clique variables
  size_t maxcolindex = 0;
  for (const auto& var : vars)
    maxcolindex = std::max(static_cast<size_t>(var.col), maxcolindex);

  // set up data
  std::vector<double> sol;
  sol.resize(maxcolindex + 1);
  for (const auto& var : vars) sol[var.col] = var.val;
  BronKerboschData data(sol);
  data.feastol = feastol;

  for (const auto& var : vars) {
    if (colsubstituted[var.col] || colDeleted[var.col]) continue;
    if (numCliques(var) != 0) data.P.emplace_back(var);
  }

  bronKerboschRecurse(data, data.P.size(), nullptr, 0);

  return std::move(data.cliques);
}